

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# craigtracer.cpp
# Opt level: O1

CraigCnfType __thiscall
CaDiCraig::CraigTracer::create_craig_interpolant
          (CraigTracer *this,CraigInterpolant interpolant,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *cnf,int *nextFreeVariable)

{
  byte *pbVar1;
  CraigConstruction CVar2;
  void *pvVar3;
  CraigConstruction CVar4;
  byte bVar5;
  CraigCnfType CVar6;
  long lVar8;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *pvVar9;
  pointer pvVar10;
  uint *nextFreeIndex;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *extraout_RDX;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *cnf_00;
  byte bVar11;
  pointer pvVar12;
  ulong uVar13;
  ulong uVar14;
  tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
  *it_1;
  CraigData *root;
  pointer piVar15;
  Aig *this_00;
  long in_R8;
  byte in_R9B;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  vVar16;
  int iVar17;
  tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
  *it;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *pvVar18;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *pvVar19;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  unaff_R13B;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *this_01;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  unaff_R14B;
  byte bVar20;
  uint uVar21;
  char *unaff_R15;
  long lVar22;
  bool bVar23;
  bool bVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  vector<int,_std::allocator<int>_> craig_trigger_clause;
  allocator_type local_121;
  pointer local_120;
  vector<int,_std::allocator<int>_> local_118;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_f8;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *pvStack_f0;
  long local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  uint local_c4;
  ulong local_c0;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_b8;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  char *pcVar7;
  
  this_00 = (Aig *)cnf;
  local_120 = (pointer)nextFreeVariable;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(cnf,(cnf->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  root = this->craig_interpolant;
  if (root == (CraigData *)0x0) {
    return (CraigCnfType)
           (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            )0x0;
  }
  local_c0 = (ulong)interpolant;
  bVar23 = 0xffffffffff6c094f <
           (ulong)(long)(int)(&switchD_007ff638::switchdataD_0093f6b0)[local_c0];
  nextFreeIndex =
       (uint *)((long)&switchD_007ff638::switchdataD_0093f6b0 +
               (long)(int)(&switchD_007ff638::switchdataD_0093f6b0)[local_c0]);
  bVar24 = (pointer)nextFreeIndex == (pointer)0x0;
  bVar11 = (byte)nextFreeIndex;
  vVar16 = SUB81(this,0);
  local_b8 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)cnf;
  switch(nextFreeIndex) {
  case (uint *)0x7ff63a:
    CVar2 = this->craig_construction;
    CVar4 = CVar2 & SYMMETRIC;
    bVar5 = (CVar2 & ASYMMETRIC) >> 1;
    bVar20 = (CVar2 & DUAL_SYMMETRIC) >> 2;
    bVar11 = (CVar2 & DUAL_ASYMMETRIC) >> 3;
LAB_007ff6af:
    local_48.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (CVar4 != NONE) {
      Aig::create_cnf(this->craig_aig_sym,&root->partial_interpolant_sym,&local_48,(int *)local_120)
      ;
    }
    if (bVar5 != 0) {
      Aig::create_cnf(this->craig_aig_asym,&this->craig_interpolant->partial_interpolant_asym,
                      &local_68,(int *)local_120);
    }
    if (bVar20 == 0) {
      unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    )0x0;
    }
    else {
      unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    )Aig::create_cnf(this->craig_aig_dual_sym,
                                     &this->craig_interpolant->partial_interpolant_dual_sym,
                                     &local_a8,(int *)local_120);
    }
    if (bVar11 != 0) {
      this_00 = this->craig_aig_dual_asym;
      root = (CraigData *)&this->craig_interpolant->partial_interpolant_dual_asym;
      cnf_00 = &local_88;
      nextFreeIndex = (uint *)local_120;
code_r0x007ff7a1:
      Aig::create_cnf(this_00,&root->partial_interpolant_sym,cnf_00,(int *)nextFreeIndex);
    }
    pcVar7 = (char *)(ulong)(byte)unaff_R14B;
    nextFreeIndex = &UINT_0093f6d4;
code_r0x007ff7b9:
    CVar6 = (*(code *)((long)&(((pointer)nextFreeIndex)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start +
                      (long)(int)*(uint *)((long)&(((pointer)nextFreeIndex)->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start +
                                          (long)pcVar7 * 4)))();
    return CVar6;
  case (uint *)0x7ff66b:
    bVar11 = (this->craig_construction & DUAL_ASYMMETRIC) >> 3;
LAB_007ff6a7:
    bVar20 = 0;
LAB_007ff6aa:
    bVar5 = 0;
LAB_007ff6ad:
    CVar4 = NONE;
    goto LAB_007ff6af;
  case (uint *)0x7ff67b:
    bVar5 = (this->craig_construction & ASYMMETRIC) >> 1;
    bVar11 = 0;
    bVar20 = 0;
    goto LAB_007ff6ad;
  case (uint *)0x7ff691:
    bVar20 = (this->craig_construction & DUAL_SYMMETRIC) >> 2;
    bVar11 = 0;
    goto LAB_007ff6aa;
  case (uint *)0x7ff6a5:
    bVar11 = 0;
    goto LAB_007ff6a7;
  case (uint *)0x7ff79e:
    cnf_00 = extraout_RDX;
    goto code_r0x007ff7a1;
  case (uint *)0x7ff7b4:
    pcVar7 = "t of %ld propagations";
    goto code_r0x007ff7b9;
  case (uint *)0x7ff7f6:
    if (bVar24) {
      switchD_007ff638::switchdataD_0093f6b0._0_1_ = 0xa5;
      anon_var_dwarf_2b8fc99[0x16] = bVar11 + 'e';
      func_0xffffffff80c01121();
      LOCK();
      *(int *)((long)&cnf[0x3000000].
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1) = (int)cnf;
      UNLOCK();
      goto code_r0x007ff832;
    }
code_r0x007ff7f8:
    bVar5 = (byte)((ulong)nextFreeIndex >> 8) ^ 0xb0;
    pcVar7 = (char *)CONCAT71(0x93f6,bVar5);
    *(char *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start =
         *(char *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start <<
         (bVar11 & 0x1f);
    *pcVar7 = *pcVar7 + bVar5;
    if (local_f8 !=
        (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
         *)0x0) {
      operator_delete(local_f8,local_e8 - (long)local_f8);
    }
    unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  )0x1;
switchD_007ff638_caseD_7ff818:
    bVar23 = interpolant < DUAL_ASYMMETRIC;
    bVar24 = interpolant == DUAL_ASYMMETRIC;
switchD_007ff638_caseD_7ff82c:
    this_01 = local_b8;
    if (bVar23 || bVar24) {
code_r0x007ff832:
      CVar6 = (*(code *)((long)&UINT_0093f6e4 + (long)(int)(&UINT_0093f6e4)[local_c0]))();
      return CVar6;
    }
    local_f8 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)0x0;
    pvStack_f0 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)0x0;
    local_e8 = 0;
    if ((char)unaff_R15 != '\0') {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,(char)unaff_R15);
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_48;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_f8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_118);
    }
    if (unaff_R13B !=
        (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
         )0x0) {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,unaff_R13B);
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_68;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_f8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_118);
    }
    if (unaff_R14B !=
        (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
         )0x0) {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,unaff_R14B);
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_a8;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_f8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_118);
    }
    if (vVar16 != (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                   )0x0) {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,vVar16);
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_88;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&local_f8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_118);
    }
    lVar8 = (long)pvStack_f0 - (long)local_f8 >> 4;
    if (lVar8 == 0) {
      unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    )0x0;
    }
    else if (lVar8 == 1) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::_M_move_assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)this_01,*(undefined8 *)(local_f8 + 8));
      unaff_R14B = *local_f8;
    }
    else {
      pvVar18 = local_f8;
      if (interpolant == SMALLEST) {
        pvVar9 = local_f8 + 0x10;
        pvVar19 = local_f8;
        if (pvVar9 != pvStack_f0 && local_f8 != pvStack_f0) {
          do {
            pvVar18 = pvVar9;
            if ((ulong)((*(long **)(pvVar19 + 8))[1] - **(long **)(pvVar19 + 8)) <=
                (ulong)((*(long **)(pvVar9 + 8))[1] - **(long **)(pvVar9 + 8))) {
              pvVar18 = pvVar19;
            }
            pvVar9 = pvVar9 + 0x10;
            pvVar19 = pvVar18;
          } while (pvVar9 != pvStack_f0);
        }
LAB_007ffc7a:
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::_M_move_assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)this_01,*(undefined8 *)(pvVar18 + 8));
        unaff_R14B = *pvVar18;
      }
      else if ((int)local_c0 == 6) {
        unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                      )0x1;
        bVar23 = true;
        for (; bVar24 = pvVar18 == pvStack_f0, !bVar24; pvVar18 = pvVar18 + 0x10) {
          if (*pvVar18 ==
              (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
               )0x1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::_M_move_assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_b8,*(undefined8 *)(pvVar18 + 8));
            this_01 = local_b8;
            break;
          }
          bVar23 = (bool)(bVar23 & *pvVar18 ==
                                   (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                                    )0x2);
          this_01 = local_b8;
        }
        if (bVar24) {
          if (bVar23) {
            unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                          )0x2;
            std::
            vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ::_M_assign_aux<std::vector<int,std::allocator<int>>const*>(this_01,0,0);
          }
          else {
            local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 *(uint *)&(local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
            local_b0 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                        *)(ulong)(uint)local_e0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
            *(uint *)&(local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start =
                 (uint)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
            __l._M_len = 1;
            __l._M_array = (iterator)&local_e0;
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_118,__l,(allocator_type *)&local_c4);
            if (local_f8 != pvStack_f0) {
              iVar17 = -(int)local_b0;
              local_b8 = pvStack_f0;
              local_c0 = CONCAT44(local_c0._4_4_,iVar17);
              pvVar18 = local_f8;
              pvVar9 = pvStack_f0;
              do {
                if (*pvVar18 ==
                    (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                     )0x3) {
                  lVar8 = *(long *)(this_01 + 8) - *(long *)this_01 >> 3;
                  pvVar12 = (pointer)(lVar8 * -0x5555555555555555);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)this_01,
                           ((long)((*(pointer *)(pvVar18 + 8))->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)((*(pointer *)(pvVar18 + 8))->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                           (long)pvVar12);
                  pvVar10 = *(pointer *)(pvVar18 + 8);
                  piVar15 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  if ((long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar15 == 0x18) {
                    uVar13 = 0;
                  }
                  else {
                    lVar22 = 0;
                    uVar13 = 0;
                    local_120 = pvVar12;
                    do {
                      std::vector<int,_std::allocator<int>_>::_M_move_assign
                                ((vector<int,_std::allocator<int>_> *)
                                 (*(long *)this_01 + lVar8 * 8 + lVar22),(long)piVar15 + lVar22);
                      uVar13 = uVar13 + 1;
                      pvVar10 = *(pointer *)(pvVar18 + 8);
                      piVar15 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                      lVar22 = lVar22 + 0x18;
                    } while (uVar13 < ((long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)piVar15 >> 3) * -0x5555555555555555 - 1U);
                    pvVar12 = (pointer)((long)&(local_120->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start + uVar13);
                    pvVar9 = local_b8;
                    iVar17 = (int)local_c0;
                  }
                  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._4_4_ =
                       **(int **)((pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + uVar13 * 6);
                  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = iVar17;
                  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                            ((vector<int,std::allocator<int>> *)
                             ((long)pvVar12 * 0x18 + *(long *)this_01),&local_e0,
                             &local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ =
                       -**(int **)(((*(pointer *)(pvVar18 + 8))->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + uVar13 * 6);
                  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (&local_118,
                               (iterator)
                               local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,(int *)&local_e0);
                  }
                  else {
                    *local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish =
                         (uint)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
                pvVar18 = pvVar18 + 0x10;
              } while (pvVar18 != pvVar9);
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)this_01,&local_118);
            local_c4 = (uint)local_b0;
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_c4;
            std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_00,&local_121);
            std::
            vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ::emplace_back<std::vector<int,std::allocator<int>>>(this_01,&local_e0);
LAB_008000af:
            pvVar3 = (void *)CONCAT44(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start._4_4_,
                                      (uint)local_e0.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,(long)local_e0.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar3);
            }
            if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                          )0x3;
          }
        }
      }
      else {
        if ((int)local_c0 != 5) {
          pvVar9 = local_f8 + 0x10;
          pvVar19 = local_f8;
          if (pvVar9 != pvStack_f0 && local_f8 != pvStack_f0) {
            do {
              pvVar18 = pvVar9;
              if ((ulong)((*(long **)(pvVar9 + 8))[1] - **(long **)(pvVar9 + 8)) <=
                  (ulong)((*(long **)(pvVar19 + 8))[1] - **(long **)(pvVar19 + 8))) {
                pvVar18 = pvVar19;
              }
              pvVar9 = pvVar9 + 0x10;
              pvVar19 = pvVar18;
            } while (pvVar9 != pvStack_f0);
          }
          goto LAB_007ffc7a;
        }
        bVar23 = true;
        for (; bVar24 = pvVar18 == pvStack_f0, !bVar24; pvVar18 = pvVar18 + 0x10) {
          if (*pvVar18 ==
              (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
               )0x2) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::_M_move_assign((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)this_01,*(undefined8 *)(pvVar18 + 8));
            break;
          }
          bVar23 = (bool)(bVar23 & *pvVar18 ==
                                   (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                                    )0x1);
        }
        unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                      )0x2;
        if (bVar24) {
          if (!bVar23) {
            uVar21 = *(uint *)&(local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start;
            uVar13 = (ulong)uVar21;
            *(uint *)&(local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start = uVar21 + 1;
            local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ = -uVar21;
            __l_01._M_len = 1;
            __l_01._M_array = (iterator)&local_e0;
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_118,__l_01,(allocator_type *)&local_c4);
            if (local_f8 != pvStack_f0) {
              local_b0 = pvStack_f0;
              pvVar18 = local_f8;
              pvVar9 = pvStack_f0;
              local_c0 = uVar13;
              do {
                if (*pvVar18 ==
                    (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                     )0x3) {
                  local_120 = (pointer)((*(long *)(this_01 + 8) - *(long *)this_01 >> 3) *
                                       -0x5555555555555555);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)this_01,
                           ((long)((*(pointer *)(pvVar18 + 8))->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)((*(pointer *)(pvVar18 + 8))->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                           (long)local_120);
                  piVar15 = ((*(pointer *)(pvVar18 + 8))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  if ((long)((*(pointer *)(pvVar18 + 8))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar15 == 0x18) {
                    uVar14 = 0;
                  }
                  else {
                    lVar8 = (long)local_120 * 0x18;
                    lVar22 = 0;
                    uVar14 = 0;
                    do {
                      std::vector<int,_std::allocator<int>_>::_M_move_assign
                                ((vector<int,_std::allocator<int>_> *)
                                 (*(long *)this_01 + lVar8 + lVar22),(long)piVar15 + lVar22);
                      uVar14 = uVar14 + 1;
                      piVar15 = ((*(pointer *)(pvVar18 + 8))->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                      lVar22 = lVar22 + 0x18;
                    } while (uVar14 < ((long)((*(pointer *)(pvVar18 + 8))->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish - (long)piVar15 >> 3)
                                      * -0x5555555555555555 - 1U);
                    local_120 = (pointer)((long)&(local_120->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_start + uVar14);
                    uVar13 = local_c0;
                    pvVar9 = local_b0;
                  }
                  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_118,
                               (iterator)
                               local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,*(int **)(piVar15 + uVar14 * 6));
                  }
                  else {
                    *local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = **(int **)(piVar15 + uVar14 * 6);
                    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = (uint)uVar13;
                  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._4_4_ =
                       -**(int **)(((*(pointer *)(pvVar18 + 8))->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + uVar14 * 6);
                  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                            ((vector<int,std::allocator<int>> *)
                             ((long)local_120 * 0x18 + *(long *)this_01),&local_e0,
                             &local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                }
                uVar21 = (uint)uVar13;
                pvVar18 = pvVar18 + 0x10;
              } while (pvVar18 != pvVar9);
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)this_01,&local_118);
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)&local_c4;
            local_c4 = uVar21;
            std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_02,&local_121);
            std::
            vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ::emplace_back<std::vector<int,std::allocator<int>>>(this_01,&local_e0);
            goto LAB_008000af;
          }
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          std::
          vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
          ::_M_assign_aux<std::vector<int,std::allocator<int>>const*>(this_01,&local_118);
          if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          unaff_R14B = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                        )0x1;
        }
      }
    }
    if (local_f8 !=
        (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
         *)0x0) {
      operator_delete(local_f8,local_e8 - (long)local_f8);
    }
    break;
  case (uint *)0x7ff804:
    goto code_r0x007ff7f8;
  case (uint *)0x7ff818:
    goto switchD_007ff638_caseD_7ff818;
  case (uint *)0x7ff82c:
    goto switchD_007ff638_caseD_7ff82c;
  case (uint *)0x7ff888:
    switchD_007ff638::switchdataD_0093f6b0._0_1_ = 0xa5;
    anon_var_dwarf_2b8fc99[0x14] = bVar11 + 'i';
    bVar23 = 0x9a < bVar11 || CARRY1(bVar11 + 'e',0x96 < bVar11);
    anon_var_dwarf_2b8fc99[0x16] = bVar11 + 'e' + (0x96 < bVar11);
    pbVar1 = (byte *)(in_R8 + -0x77);
    bVar5 = *pbVar1;
    bVar20 = *pbVar1;
    *pbVar1 = bVar20 + in_R9B + bVar23;
    *unaff_R15 = *unaff_R15 + in_R9B + (CARRY1(bVar5,in_R9B) || CARRY1(bVar20 + in_R9B,bVar23));
    *(byte *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start =
         *(char *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start - bVar11;
    *(undefined4 *)
     &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start = extraout_XMM0_Da;
    *(undefined4 *)
     ((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start + 4) =
         extraout_XMM0_Db;
    *(undefined4 *)
     &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_finish = extraout_XMM0_Dc;
    *(undefined4 *)
     ((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_finish + 4) =
         extraout_XMM0_Dd;
    local_88.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nextFreeIndex;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)this_00);
    unaff_R14B = vVar16;
    break;
  case (uint *)0x7ff8e4:
    DAT_0093f690 = DAT_0093f690 + -0x70;
    anon_var_dwarf_2b8fc81[0x18] = bVar11 + 'e';
    bVar23 = 0x90 < bVar11 || CARRY1(bVar11 + 'o',0x9a < bVar11);
    anon_var_dwarf_2b8fc81[0x1a] = bVar11 + 'o' + (0x9a < bVar11);
    pbVar1 = (byte *)(in_R8 + -0x77);
    bVar5 = *pbVar1;
    bVar20 = *pbVar1;
    *pbVar1 = bVar20 + in_R9B + bVar23;
    *unaff_R15 = *unaff_R15 + in_R9B + (CARRY1(bVar5,in_R9B) || CARRY1(bVar20 + in_R9B,bVar23));
    *(byte *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start =
         *(char *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start - bVar11;
    *(undefined4 *)
     &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start = extraout_XMM0_Da;
    *(undefined4 *)
     ((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start + 4) =
         extraout_XMM0_Db;
    *(undefined4 *)
     &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_finish = extraout_XMM0_Dc;
    *(undefined4 *)
     ((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_finish + 4) =
         extraout_XMM0_Dd;
    local_68.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nextFreeIndex;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)this_00);
    unaff_R14B = unaff_R13B;
    break;
  case (uint *)0x7ff940:
    DAT_0093f690 = DAT_0093f690 + -0x70;
    anon_var_dwarf_2b8fc81[0x18] = bVar11 + 'e';
    bVar23 = 0x90 < bVar11 || CARRY1(bVar11 + 'o',0x9a < bVar11);
    anon_var_dwarf_2b8fc81[0x1a] = bVar11 + 'o' + (0x9a < bVar11);
    pbVar1 = (byte *)(in_R8 + -0x77);
    bVar5 = *pbVar1;
    bVar20 = *pbVar1;
    *pbVar1 = bVar20 + in_R9B + bVar23;
    *unaff_R15 = *unaff_R15 + in_R9B + (CARRY1(bVar5,in_R9B) || CARRY1(bVar20 + in_R9B,bVar23));
    *(byte *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start =
         *(char *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start - bVar11;
    *(undefined4 *)
     &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start = extraout_XMM0_Da;
    *(undefined4 *)
     ((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_start + 4) =
         extraout_XMM0_Db;
    *(undefined4 *)
     &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_finish = extraout_XMM0_Dc;
    *(undefined4 *)
     ((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&this_00->nodes)->_M_impl).super__Vector_impl_data._M_finish + 4) =
         extraout_XMM0_Dd;
    local_a8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nextFreeIndex;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)this_00);
    break;
  case (uint *)0x7ffaa6:
    CVar4 = this->craig_construction & SYMMETRIC;
    bVar11 = 0;
    bVar20 = 0;
    bVar5 = 0;
    goto LAB_007ff6af;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  return (CraigCnfType)unaff_R14B;
}

Assistant:

CraigCnfType
CraigTracer::create_craig_interpolant (CraigInterpolant interpolant,
                                       std::vector<std::vector<int>> &cnf,
                                       int &nextFreeVariable) {
  cnf.clear ();

  if (!has_craig_interpolant ()) {
    return CraigCnfType::NONE;
  }

  bool build_cnf_sym = false;
  bool build_cnf_asym = false;
  bool build_cnf_dual_sym = false;
  bool build_cnf_dual_asym = false;
  switch (interpolant) {
  case CraigInterpolant::NONE:
    break;
  case CraigInterpolant::SYMMETRIC:
    build_cnf_sym = is_construction_enabled (CraigConstruction::SYMMETRIC);
    break;
  case CraigInterpolant::ASYMMETRIC:
    build_cnf_asym =
        is_construction_enabled (CraigConstruction::ASYMMETRIC);
    break;
  case CraigInterpolant::DUAL_SYMMETRIC:
    build_cnf_dual_sym =
        is_construction_enabled (CraigConstruction::DUAL_SYMMETRIC);
    break;
  case CraigInterpolant::DUAL_ASYMMETRIC:
    build_cnf_dual_asym =
        is_construction_enabled (CraigConstruction::DUAL_ASYMMETRIC);
    break;
  case CraigInterpolant::INTERSECTION:
  case CraigInterpolant::UNION:
  case CraigInterpolant::SMALLEST:
  case CraigInterpolant::LARGEST:
    build_cnf_sym = is_construction_enabled (CraigConstruction::SYMMETRIC);
    build_cnf_asym =
        is_construction_enabled (CraigConstruction::ASYMMETRIC);
    build_cnf_dual_sym =
        is_construction_enabled (CraigConstruction::DUAL_SYMMETRIC);
    build_cnf_dual_asym =
        is_construction_enabled (CraigConstruction::DUAL_ASYMMETRIC);
    break;

  default:
    assert (false); // Seleted craig interpolation type not supported!
    __builtin_unreachable ();
  }

  std::vector<std::vector<int>> craig_cnf_sym;
  std::vector<std::vector<int>> craig_cnf_asym;
  std::vector<std::vector<int>> craig_cnf_dual_sym;
  std::vector<std::vector<int>> craig_cnf_dual_asym;
  CraigCnfType craig_cnf_type_sym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_asym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_dual_sym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_dual_asym = CraigCnfType::NONE;

  if (build_cnf_sym)
    craig_cnf_type_sym = craig_aig_sym->create_cnf (
        craig_interpolant->partial_interpolant_sym, craig_cnf_sym,
        nextFreeVariable);
  if (build_cnf_asym)
    craig_cnf_type_asym = craig_aig_asym->create_cnf (
        craig_interpolant->partial_interpolant_asym, craig_cnf_asym,
        nextFreeVariable);
  if (build_cnf_dual_sym)
    craig_cnf_type_dual_sym = craig_aig_dual_sym->create_cnf (
        craig_interpolant->partial_interpolant_dual_sym, craig_cnf_dual_sym,
        nextFreeVariable);
  if (build_cnf_dual_asym)
    craig_cnf_type_dual_asym = craig_aig_dual_asym->create_cnf (
        craig_interpolant->partial_interpolant_dual_asym,
        craig_cnf_dual_asym, nextFreeVariable);

  // Dual Craig interpolants have to be inverted.
  // However, the construction rules for the dual asymmetric interpolant
  // already incorporates the negation. So only the dual symmetric
  // interpolant needs to be negated.
  if (craig_cnf_type_dual_sym == CraigCnfType::CONSTANT1) {
    craig_cnf_dual_sym = {{}};
    craig_cnf_type_dual_sym = CraigCnfType::CONSTANT0;
  } else if (craig_cnf_type_dual_sym == CraigCnfType::CONSTANT0) {
    craig_cnf_dual_sym = {};
    craig_cnf_type_dual_sym = CraigCnfType::CONSTANT1;
  } else if (craig_cnf_type_dual_sym == CraigCnfType::NORMAL) {
    craig_cnf_dual_sym.back ()[0] = -craig_cnf_dual_sym.back ()[0];
  }

  if (interpolant == CraigInterpolant::NONE) {
    cnf = {};
    return CraigCnfType::NONE;
  } else if (interpolant == CraigInterpolant::SYMMETRIC) {
    cnf = std::move (craig_cnf_sym);
    return craig_cnf_type_sym;
  } else if (interpolant == CraigInterpolant::ASYMMETRIC) {
    cnf = std::move (craig_cnf_asym);
    return craig_cnf_type_asym;
  } else if (interpolant == CraigInterpolant::DUAL_SYMMETRIC) {
    cnf = std::move (craig_cnf_dual_sym);
    return craig_cnf_type_dual_sym;
  } else if (interpolant == CraigInterpolant::DUAL_ASYMMETRIC) {
    cnf = std::move (craig_cnf_dual_asym);
    return craig_cnf_type_dual_asym;
  }

  std::vector<std::tuple<std::vector<std::vector<int>> *, CraigCnfType>>
      craig_cnfs{};
  if (craig_cnf_type_sym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_sym, craig_cnf_type_sym});
  if (craig_cnf_type_asym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_asym, craig_cnf_type_asym});
  if (craig_cnf_type_dual_sym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_dual_sym, craig_cnf_type_dual_sym});
  if (craig_cnf_type_dual_asym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_dual_asym, craig_cnf_type_dual_asym});

  if (craig_cnfs.size () == 0) {
    return CraigCnfType::NONE;
  } else if (craig_cnfs.size () == 1) {
    cnf = std::move (*std::get<0> (craig_cnfs[0]));
    return std::get<1> (craig_cnfs[0]);
  }

  // We have at least two Craig interpolants for the following computations.
  if (interpolant == CraigInterpolant::UNION) {
    bool allConstantOne = true;
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::CONSTANT0) {
        cnf = std::move (*std::get<0> (it));
        return CraigCnfType::CONSTANT0;
      }
      allConstantOne &= (std::get<1> (it) == CraigCnfType::CONSTANT1);
    }
    if (allConstantOne) {
      cnf = {};
      return CraigCnfType::CONSTANT1;
    }

    // Create trigger (t) that enforces all CNF parts.
    int craig_trigger = nextFreeVariable++;
    std::vector<int> craig_trigger_clause{craig_trigger};
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::NORMAL) {
        size_t i = 0, j = cnf.size ();
        cnf.resize (cnf.size () + std::get<0> (it)->size ());
        for (; i < std::get<0> (it)->size () - 1u; i++, j++)
          cnf[j] = std::move ((*std::get<0> (it))[i]);
        // The positive trigger implies that all CNF parts are enabled: (t
        // -> t_1) = (-t v t_1)
        cnf[j] = {-craig_trigger, (*std::get<0> (it))[i][0]};
        // The negative trigger implies that at least one of the CNF parts
        // is not enabled: (-t -> (-t_1 v ... v -t_n)) = (t v -t_1 v ...
        // -t_n)
        craig_trigger_clause.push_back (-(*std::get<0> (it))[i][0]);
      }
    }

    cnf.push_back (craig_trigger_clause);
    cnf.push_back ({craig_trigger});

    return CraigCnfType::NORMAL;
  } else if (interpolant == CraigInterpolant::INTERSECTION) {
    bool allConstantZero = true;
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::CONSTANT1) {
        cnf = std::move (*std::get<0> (it));
        return CraigCnfType::CONSTANT1;
      }
      allConstantZero &= (std::get<1> (it) == CraigCnfType::CONSTANT0);
    }
    if (allConstantZero) {
      cnf = {{}};
      return CraigCnfType::CONSTANT0;
    }

    // Create trigger (t) that enforces all CNF parts.
    int craig_trigger = nextFreeVariable++;
    std::vector<int> craig_trigger_clause{-craig_trigger};
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::NORMAL) {
        size_t i = 0, j = cnf.size ();
        cnf.resize (cnf.size () + std::get<0> (it)->size ());
        for (; i < std::get<0> (it)->size () - 1u; i++, j++)
          cnf[j] = std::move ((*std::get<0> (it))[i]);
        // The positive trigger implies that one of the CNF parts is
        // enabled: (t -> (t_1 v ... v t_n)) = (-t v t_1 v ... t_n)
        craig_trigger_clause.push_back ((*std::get<0> (it))[i][0]);
        // The negative trigger implies that at all CNF parts are not
        // enabled: (-t -> -t_1) = (t v -t_1)
        cnf[j] = {craig_trigger, -(*std::get<0> (it))[i][0]};
      }
    }

    cnf.push_back (craig_trigger_clause);
    cnf.push_back ({craig_trigger});

    return CraigCnfType::NORMAL;
  } else if (interpolant == CraigInterpolant::SMALLEST) {
    auto compare = [] (const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem1,
                       const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem2) {
      return (std::get<0> (elem1)->size () < std::get<0> (elem2)->size ());
    };
    auto minimum =
        std::min_element (craig_cnfs.begin (), craig_cnfs.end (), compare);
    cnf = std::move (*std::get<0> (*minimum));
    return std::get<1> (*minimum);
  } else if (interpolant == CraigInterpolant::LARGEST) {
    auto compare = [] (const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem1,
                       const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem2) {
      return (std::get<0> (elem1)->size () < std::get<0> (elem2)->size ());
    };
    auto maximum =
        std::max_element (craig_cnfs.begin (), craig_cnfs.end (), compare);
    cnf = std::move (*std::get<0> (*maximum));
    return std::get<1> (*maximum);
  } else {
    assert (false); // Seleted craig interpolation type not supported!
    __builtin_unreachable ();
  }
}